

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen-io.h
# Opt level: O2

istringstream * Eigen::operator>>(istringstream *iss,Vector *inst)

{
  int iVar1;
  istream *piVar2;
  Scalar *pSVar3;
  ExceptionSignal *pEVar4;
  uint i;
  ulong index;
  char _ch;
  ErrorCodeEnum local_140;
  uint _size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  Scalar local_118;
  double _dbl_val;
  format fmt;
  
  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
            (&fmt,"Failed to enter %s as vector. Reenter as [N](val1,val2,val3,...,valN)");
  std::__cxx11::stringbuf::str();
  boost::io::detail::
  feed<char,std::char_traits<char>,std::allocator<char>,std::__cxx11::string_const&>
            (&fmt,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  piVar2 = std::operator>>((istream *)iss,&_ch);
  if ((((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) && (_ch != '[')) {
    pEVar4 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
    local_140 = GENERIC;
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (&local_138,&fmt);
    dynamicgraph::ExceptionSignal::ExceptionSignal(pEVar4,&local_140,(string *)&local_138);
    __cxa_throw(pEVar4,&dynamicgraph::ExceptionSignal::typeinfo,
                dynamicgraph::ExceptionAbstract::~ExceptionAbstract);
  }
  piVar2 = std::istream::_M_extract<unsigned_int>((uint *)iss);
  if ((((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) ||
     (((byte)iss[*(long *)(*(long *)iss + -0x18) + 0x20] & 5) != 0)) {
    pEVar4 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
    local_140 = GENERIC;
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (&local_138,&fmt);
    dynamicgraph::ExceptionSignal::ExceptionSignal(pEVar4,&local_140,(string *)&local_138);
    __cxa_throw(pEVar4,&dynamicgraph::ExceptionSignal::typeinfo,
                dynamicgraph::ExceptionAbstract::~ExceptionAbstract);
  }
  PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&inst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(ulong)_size);
  piVar2 = std::operator>>((istream *)iss,&_ch);
  if ((((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) && (_ch != ']')) {
    pEVar4 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
    local_140 = GENERIC;
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (&local_138,&fmt);
    dynamicgraph::ExceptionSignal::ExceptionSignal(pEVar4,&local_140,(string *)&local_138);
    __cxa_throw(pEVar4,&dynamicgraph::ExceptionSignal::typeinfo,
                dynamicgraph::ExceptionAbstract::~ExceptionAbstract);
  }
  piVar2 = std::operator>>((istream *)iss,&_ch);
  if ((((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) && (_ch != '(')) {
    pEVar4 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
    local_140 = GENERIC;
    boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
              (&local_138,&fmt);
    dynamicgraph::ExceptionSignal::ExceptionSignal(pEVar4,&local_140,(string *)&local_138);
    __cxa_throw(pEVar4,&dynamicgraph::ExceptionSignal::typeinfo,
                dynamicgraph::ExceptionAbstract::~ExceptionAbstract);
  }
  index = 0;
  do {
    if (_size <= index) {
      piVar2 = std::operator>>((istream *)iss,&_ch);
      if ((((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) && (_ch != ')')) {
        pEVar4 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
        local_140 = GENERIC;
        boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::str_abi_cxx11_
                  (&local_138,&fmt);
        dynamicgraph::ExceptionSignal::ExceptionSignal(pEVar4,&local_140,(string *)&local_138);
        __cxa_throw(pEVar4,&dynamicgraph::ExceptionSignal::typeinfo,
                    dynamicgraph::ExceptionAbstract::~ExceptionAbstract);
      }
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format(&fmt);
      return iss;
    }
    std::istream::_M_extract<double>((double *)iss);
    iVar1 = std::istream::peek();
    if (iVar1 == 0x2c) {
LAB_001212b9:
      std::istream::ignore();
    }
    else {
      iVar1 = std::istream::peek();
      if (iVar1 == 0x20) goto LAB_001212b9;
    }
    local_118 = _dbl_val;
    pSVar3 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)inst,index);
    *pSVar3 = local_118;
    index = index + 1;
  } while( true );
}

Assistant:

inline std::istringstream &operator>>(std::istringstream &iss,
                                      dynamicgraph::Vector &inst) {
  unsigned int _size;
  double _dbl_val;
  char _ch;
  boost::format fmt(
      "Failed to enter %s as vector."
      " Reenter as [N](val1,val2,val3,...,valN)");
  fmt % iss.str();
  if (iss >> _ch && _ch != '[') {
    throw ExceptionSignal(ExceptionSignal::GENERIC, fmt.str());
  } else {
    if (iss >> _size && !iss.fail()) {
      inst.resize(_size);
    } else
      throw ExceptionSignal(ExceptionSignal::GENERIC, fmt.str());
    if (iss >> _ch && _ch != ']')
      throw ExceptionSignal(ExceptionSignal::GENERIC, fmt.str());
    else {
      if (iss >> _ch && _ch != '(')
        throw ExceptionSignal(ExceptionSignal::GENERIC, fmt.str());
      else {
        for (unsigned int i = 0; i < _size; i++) {
          iss >> _dbl_val;
          if (iss.peek() == ',' || iss.peek() == ' ') iss.ignore();
          inst(i) = _dbl_val;
        }
        if (iss >> _ch && _ch != ')')
          throw ExceptionSignal(ExceptionSignal::GENERIC, fmt.str());
      }
    }
  }
  return iss;
}